

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  LogLevelSet(2);
  _uart_init(argc,argv);
  unisound_app_start(_hbm_command_cb);
  do {
    usleep(1000000);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  LogLevelSet(N_LOG_TRACK);
  _uart_init(argc, argv);
  unisound_app_start(_hbm_command_cb);
  while (1) usleep(1000 * 1000);
  return 0;
}